

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::wake(UnixEventPort *this)

{
  int iVar1;
  ssize_t sVar2;
  Fault f;
  uint64_t one;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_28 = 1;
  do {
    sVar2 = ::write((this->eventFd).fd,&local_28,8);
    if (-1 < sVar2) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_40.exception = (Exception *)0x0;
    local_38 = 0;
    uStack_30 = 0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_40);
  }
  if (sVar2 == 8 || sVar2 < 0) {
    return;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

void UnixEventPort::wake() const {
  uint64_t one = 1;
  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = write(eventFd, &one, sizeof(one)));
  KJ_ASSERT(n < 0 || n == sizeof(one));
}